

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

uint32_t __thiscall protozero::Message::Finalize(Message *this)

{
  if (this->finalized_ == false) {
    if (this->nested_message_ != (Message *)0x0) {
      EndNestedMessage(this);
    }
    if (this->size_field_ != (uint8_t *)0x0) {
      proto_utils::WriteRedundantVarInt
                (this->size_ - this->size_already_written_,this->size_field_,4);
      this->size_field_ = (uint8_t *)0x0;
    }
    this->finalized_ = true;
  }
  return this->size_;
}

Assistant:

uint32_t Message::Finalize() {
  if (finalized_)
    return size_;

  if (nested_message_)
    EndNestedMessage();

  // Write the length of the nested message a posteriori, using a leading-zero
  // redundant varint encoding.
  if (size_field_) {
    PERFETTO_DCHECK(!finalized_);
    PERFETTO_DCHECK(size_ < proto_utils::kMaxMessageLength);
    PERFETTO_DCHECK(size_ >= size_already_written_);
    proto_utils::WriteRedundantVarInt(size_ - size_already_written_,
                                      size_field_);
    size_field_ = nullptr;
  }

  finalized_ = true;
#if PERFETTO_DCHECK_IS_ON()
  if (handle_)
    handle_->reset_message();
#endif

  return size_;
}